

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> *in_RCX;
  undefined1 local_70 [8];
  Vector<float,_3> local_68;
  MatrixCaseUtils local_5c [12];
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_3,_2> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data[2] = (evalCtx->coords).m_data[2];
    local_68.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_3>::Vector(&local_68,(Vector<float,_3> *)s_constInVec3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_70 = *(undefined1 (*) [8])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)local_70,(Vector<float,_2> *)(s_constInVec2 + 8));
  }
  outerProduct<float,2,3>
            (&local_38,(MatrixCaseUtils *)&local_68,(Vector<float,_3> *)local_70,in_RCX);
  reduceToVec3(local_5c,&local_38);
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,(Vector<float,_3> *)local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}